

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astMessageSendNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t astNode;
  _Bool _Var1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t slotCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_functionCallFrameStack_t callFrameStack;
  sysbvm_tuple_t local_198;
  sysbvm_tuple_t *psStack_190;
  sysbvm_tuple_t local_188;
  sysbvm_tuple_t sStack_180;
  sysbvm_tuple_t local_178;
  sysbvm_tuple_t sStack_170;
  sysbvm_tuple_t local_168;
  sysbvm_tuple_t sStack_160;
  sysbvm_tuple_t local_158;
  sysbvm_tuple_t sStack_150;
  undefined8 local_148;
  sysbvm_stackFrameRecord_t local_140;
  undefined8 local_130;
  sysbvm_stackFrameRecord_t local_128;
  undefined8 local_118;
  undefined1 *puStack_110;
  sysbvm_stackFrameRecord_t local_108;
  undefined8 local_f8;
  anon_struct_136_2_7a050327_for_gcRoots *paStack_f0;
  sysbvm_functionCallFrameStack_t local_e8;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_158 = 0;
  sStack_150 = 0;
  local_168 = 0;
  sStack_160 = 0;
  local_178 = 0;
  sStack_170 = 0;
  local_188 = 0;
  sStack_180 = 0;
  local_198 = 0;
  psStack_190 = (sysbvm_tuple_t *)0x0;
  slotCount = 0;
  local_148 = 0;
  local_128.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_128.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_128._12_4_ = 0;
  local_118 = 0xb;
  puStack_110 = (undefined1 *)&local_198;
  sysbvm_stackFrame_pushRecord(&local_128);
  local_140.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_140.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_130 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_140);
  sVar3 = *arguments;
  uVar2 = *(ulong *)(sVar3 + 0x40);
  if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
    slotCount = (sysbvm_tuple_t)(*(uint *)(uVar2 + 0xc) >> 3);
  }
  astNode = *(sysbvm_tuple_t *)(sVar3 + 0x28);
  if (astNode == 0) {
    local_188 = sysbvm_interpreter_evaluateASTWithEnvironment
                          (context,*(sysbvm_tuple_t *)(sVar3 + 0x38),arguments[1]);
    _Var1 = sysbvm_environment_lookSymbolRecursively(context,arguments[1],local_188,&local_178);
    if ((!_Var1) || (_Var1 = sysbvm_symbolBinding_isValue(context,local_178), !_Var1)) {
      sysbvm_error("Failed to find symbol for message send without receiver.");
    }
    if (((local_178 & 0xf) == 0 && local_178 != 0) && (0x57 < *(uint *)(local_178 + 0xc))) {
      sStack_180 = *(sysbvm_tuple_t *)(local_178 + 0x38);
    }
    else {
      sStack_180 = 0;
    }
  }
  else {
    psStack_190 = (sysbvm_tuple_t *)
                  sysbvm_interpreter_evaluateASTWithEnvironment(context,astNode,arguments[1]);
    if (*(sysbvm_tuple_t *)(*arguments + 0x30) == 0) {
      uVar2 = (ulong)psStack_190 & 0xf;
      if (uVar2 == 0 && psStack_190 != (sysbvm_tuple_t *)0x0) {
        local_198 = *psStack_190;
      }
      else if ((int)uVar2 == 0xf) {
        local_198 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psStack_190 >> 4);
      }
      else {
        local_198 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar2);
      }
    }
    else {
      local_198 = sysbvm_interpreter_evaluateASTWithEnvironment
                            (context,*(sysbvm_tuple_t *)(*arguments + 0x30),arguments[1]);
    }
    local_188 = sysbvm_interpreter_evaluateASTWithEnvironment
                          (context,*(sysbvm_tuple_t *)(*arguments + 0x38),arguments[1]);
    sStack_180 = sysbvm_type_lookupSelector(context,local_198,local_188);
    if (sStack_180 == 0) {
      sStack_180 = sysbvm_type_lookupSelector
                             (context,local_198,(context->roots).doesNotUnderstandSelector);
      if (sStack_180 == 0) {
        sysbvm_error("Message not understood.");
      }
      sStack_160 = sysbvm_array_create(context,slotCount);
      if (slotCount != 0) {
        sVar3 = 0;
        do {
          uVar2 = *(ulong *)(*arguments + 0x40);
          if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
            sStack_170 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + sVar3 * 8);
          }
          else {
            sStack_170 = 0;
          }
          local_168 = sysbvm_interpreter_evaluateASTWithEnvironment(context,sStack_170,arguments[1])
          ;
          if ((local_168 & 0xf) == 0 && local_168 != 0) {
            *(sysbvm_tuple_t *)(local_168 + 0x10 + sVar3 * 8) = local_168;
          }
          sVar3 = sVar3 + 1;
        } while (slotCount != sVar3);
      }
      local_158 = sysbvm_message_create
                            (context,local_188,sStack_160,local_198,
                             *(sysbvm_tuple_t *)(*arguments + 0x10));
      local_e8.applicationFlags = (sysbvm_bitflags_t)psStack_190;
      local_e8._8_8_ = local_158;
      sStack_150 = sysbvm_function_apply(context,sStack_180,2,&local_e8.applicationFlags,1);
      goto LAB_00126bce;
    }
  }
  memset(&local_e8,0,0xb0);
  local_108.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_108.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_108._12_4_ = 0;
  local_f8 = 0x11;
  paStack_f0 = &local_e8.gcRoots;
  sysbvm_stackFrame_pushRecord(&local_108);
  sysbvm_functionCallFrameStack_begin(context,&local_e8,sStack_180,(astNode != 0) + slotCount,0);
  if (astNode != 0) {
    sysbvm_functionCallFrameStack_push(&local_e8,(sysbvm_tuple_t)psStack_190);
  }
  if (slotCount != 0) {
    sVar3 = 0;
    do {
      uVar2 = *(ulong *)(*arguments + 0x40);
      if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
        sStack_170 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + sVar3 * 8);
      }
      else {
        sStack_170 = 0;
      }
      local_168 = sysbvm_interpreter_evaluateASTWithEnvironment(context,sStack_170,arguments[1]);
      sysbvm_functionCallFrameStack_push(&local_e8,local_168);
      sVar3 = sVar3 + 1;
    } while (slotCount != sVar3);
  }
  sysbvm_stackFrame_popRecord(&local_108);
  sStack_150 = sysbvm_functionCallFrameStack_finish(context,&local_e8);
LAB_00126bce:
  sysbvm_stackFrame_popRecord(&local_140);
  sysbvm_stackFrame_popRecord(&local_128);
  return sStack_150;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageSendNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMessageSendNode_t **sendNode = (sysbvm_astMessageSendNode_t**)node;
    struct {
        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t receiver;
        sysbvm_tuple_t selector;
        sysbvm_tuple_t method;
        sysbvm_tuple_t methodBinding;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argument;
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t message;
        sysbvm_tuple_t result;

        sysbvm_tuple_t receiverString;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*sendNode)->super.sourcePosition);

    bool hasReceiver = false;
    size_t applicationArgumentCount = sysbvm_array_getSize((*sendNode)->arguments);
    if((*sendNode)->receiver)
    {
        gcFrame.receiver = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*sendNode)->receiver, *environment);
        hasReceiver = true;

        if((*sendNode)->receiverLookupType)
            gcFrame.receiverType = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*sendNode)->receiverLookupType, *environment);
        else
            gcFrame.receiverType = sysbvm_tuple_getType(context, gcFrame.receiver);
        gcFrame.selector = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*sendNode)->selector, *environment);
        gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, gcFrame.selector);
        if(!gcFrame.method)
        {
            gcFrame.method = sysbvm_type_lookupSelector(context, gcFrame.receiverType, context->roots.doesNotUnderstandSelector);
            if(!gcFrame.method)
                sysbvm_error("Message not understood.");

            gcFrame.arguments = sysbvm_array_create(context, applicationArgumentCount);
            for(size_t i = 0; i < applicationArgumentCount; ++i)
            {
                gcFrame.argumentNode = sysbvm_array_at((*sendNode)->arguments, i);
                gcFrame.argument = sysbvm_interpreter_evaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
                sysbvm_array_atPut(gcFrame.argument, i, gcFrame.argument);
            }

            gcFrame.message = sysbvm_message_create(context, gcFrame.selector, gcFrame.arguments, gcFrame.receiverType, (*sendNode)->super.sourcePosition);
            gcFrame.result = sysbvm_function_applyNoCheck2(context, gcFrame.method, gcFrame.receiver, gcFrame.message);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return gcFrame.result;
        }
    }
    else
    {
        gcFrame.selector = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*sendNode)->selector, *environment);
        if(!sysbvm_environment_lookSymbolRecursively(context, *environment, gcFrame.selector, &gcFrame.methodBinding)
            || !sysbvm_symbolBinding_isValue(context, gcFrame.methodBinding))
            sysbvm_error("Failed to find symbol for message send without receiver.");
        gcFrame.method = sysbvm_symbolValueBinding_getValue(gcFrame.methodBinding);
    }


    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.method, applicationArgumentCount + (hasReceiver ? 1 : 0), 0);

    if(hasReceiver)
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.receiver);

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*sendNode)->arguments, i);
        gcFrame.argument = sysbvm_interpreter_evaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment);
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.argument);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    gcFrame.result = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}